

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O3

int SLOT_SET(ym2612_ *YM2612,int Adr,uchar data)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  
  uVar3 = Adr & 3;
  if (uVar3 == 3) {
    return 1;
  }
  uVar1 = uVar3 + 3;
  if (((uint)Adr >> 8 & 1) == 0) {
    uVar1 = uVar3;
  }
  uVar3 = (Adr & 0xf0U) - 0x30 >> 4;
  if (6 < uVar3) {
    return 0;
  }
  uVar6 = (ulong)(((uint)Adr >> 2 & 3) * 0x88);
  switch(uVar3) {
  case 0:
    iVar5 = 1;
    if ((data & 0xf) != 0) {
      iVar5 = (data & 0xf) * 2;
    }
    *(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].MUL + uVar6) = iVar5;
    *(int **)((long)&YM2612->CHANNEL[uVar1].SLOT[0].DT + uVar6) =
         YM2612->DT_TAB[0] + (ulong)(data & 0x70) * 2;
    YM2612->CHANNEL[uVar1].SLOT[0].Finc = -1;
    return 0;
  case 1:
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].TL + uVar6) = data & 0x7f;
    YM2612_Update(YM2612,(DEV_SMPL **)0x0,0);
    *(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].TLL + uVar6) =
         *(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].TL + uVar6) << 5;
    return 0;
  case 2:
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].KSR_S + uVar6) = (uint)((byte)~data >> 6);
    YM2612->CHANNEL[uVar1].SLOT[0].Finc = -1;
    puVar4 = NULL_RATE;
    if ((data & 0x1f) != 0) {
      puVar4 = YM2612->AR_TAB + (byte)((data & 0x1f) * '\x02');
    }
    *(uint **)((long)&YM2612->CHANNEL[uVar1].SLOT[0].AR + uVar6) = puVar4;
    uVar3 = puVar4[*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].KSR + uVar6)];
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].EincA + uVar6) = uVar3;
    if (*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].Ecurp + uVar6) != 0) {
      return 0;
    }
    goto LAB_00131fa7;
  case 3:
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].AMSon + uVar6) = (uint)(data & 0x80);
    iVar5 = 0x1f;
    if ((data & 0x80) != 0) {
      iVar5 = YM2612->CHANNEL[uVar1].AMS;
    }
    *(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].AMS + uVar6) = iVar5;
    puVar4 = NULL_RATE;
    if ((data & 0x1f) != 0) {
      puVar4 = YM2612->DR_TAB + (byte)((data & 0x1f) * '\x02');
    }
    *(uint **)((long)&YM2612->CHANNEL[uVar1].SLOT[0].DR + uVar6) = puVar4;
    uVar3 = puVar4[*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].KSR + uVar6)];
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].EincD + uVar6) = uVar3;
    if (*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].Ecurp + uVar6) != 1) {
      return 0;
    }
    goto LAB_00131fa7;
  case 4:
    puVar4 = NULL_RATE;
    if ((data & 0x1f) != 0) {
      puVar4 = YM2612->DR_TAB + (byte)((data & 0x1f) * '\x02');
    }
    *(uint **)((long)&YM2612->CHANNEL[uVar1].SLOT[0].SR + uVar6) = puVar4;
    uVar3 = puVar4[*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].KSR + uVar6)];
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].EincS + uVar6) = uVar3;
    if (*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].Ecurp + uVar6) != 2) {
      return 0;
    }
    break;
  case 5:
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].SLL + uVar6) = SL_TAB[data >> 4];
    uVar2 = (ulong)((data & 0xf) << 4 | 8);
    *(ulong *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].RR + uVar6) = (long)YM2612->DR_TAB + uVar2;
    uVar3 = *(uint *)((long)YM2612->DR_TAB +
                     (long)*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].KSR + uVar6) * 4 + uVar2);
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].EincR + uVar6) = uVar3;
    if (*(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].Ecurp + uVar6) != 3) {
      return 0;
    }
    break;
  case 6:
    uVar3 = (uint)data;
    if (YM2612->Enable_SSGEG != '\0') {
      uVar3 = 0;
    }
    if ((uVar3 & 8) == 0) {
      *(undefined4 *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].SEG + uVar6) = 0;
      return 0;
    }
    *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].SEG + uVar6) = uVar3 & 0xf;
    return 0;
  }
  if (0x1fffffff < *(int *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].Ecnt + uVar6)) {
    return 0;
  }
LAB_00131fa7:
  *(uint *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].Einc + uVar6) = uVar3;
  return 0;
}

Assistant:

int SLOT_SET(ym2612_ *YM2612, int Adr, unsigned char data)
{
  channel_ *CH;
  slot_ *SL;
  int nch, nsl;

  if ((nch = Adr & 3) == 3)
    return 1;
  nsl = (Adr >> 2) & 3;

  if (Adr & 0x100)
   nch += 3;

  CH = &(YM2612->CHANNEL[nch]);
  SL = &(CH->SLOT[nsl]);

  switch (Adr & 0xF0)
  {
    case 0x30:
      if ((SL->MUL = (data & 0x0F)))
        SL->MUL <<= 1;
      else
        SL->MUL = 1;

      SL->DT = YM2612->DT_TAB[(data >> 4) & 7];

      CH->SLOT[0].Finc = -1;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] DTMUL = %.2X\n", nch, nsl, data & 0x7F);
#endif
      break;

    case 0x40:
      SL->TL = data & 0x7F;

      // SOR2 do a lot of TL adjustement and this fix R.Shinobi jump sound...
      YM2612_Special_Update(YM2612);

#if ((ENV_HBITS - 7) < 0)
      SL->TLL = SL->TL >> (7 - ENV_HBITS);
#else
      SL->TLL = SL->TL << (ENV_HBITS - 7);
#endif

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] TL = %.2X\n", nch, nsl, SL->TL);
#endif
      break;

    case 0x50:
      SL->KSR_S = 3 - (data >> 6);

      CH->SLOT[0].Finc = -1;

      if (data &= 0x1F)
        SL->AR = &YM2612->AR_TAB[data << 1];
      else
        SL->AR = &NULL_RATE[0];

      SL->EincA = SL->AR[SL->KSR];
      if (SL->Ecurp == ATTACK)
        SL->Einc = SL->EincA;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] AR = %.2X  EincA = %.6X\n", nch, nsl, data, SL->EincA);
#endif
      break;

    case 0x60:
      if ((SL->AMSon = (data & 0x80)))
        SL->AMS = CH->AMS;
      else
      SL->AMS = 31;

      if (data &= 0x1F)
        SL->DR = &YM2612->DR_TAB[data << 1];
      else
        SL->DR = &NULL_RATE[0];

      SL->EincD = SL->DR[SL->KSR];
      if (SL->Ecurp == DECAY)
        SL->Einc = SL->EincD;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] AMS = %d  DR = %.2X  EincD = %.6X\n", nch, nsl, SL->AMSon, data, SL->EincD);
#endif
      break;

    case 0x70:
      if (data &= 0x1F)
        SL->SR = &YM2612->DR_TAB[data << 1];
      else
        SL->SR = &NULL_RATE[0];

      SL->EincS = SL->SR[SL->KSR];
      if ((SL->Ecurp == SUBSTAIN) && (SL->Ecnt < ENV_END))
        SL->Einc = SL->EincS;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] SR = %.2X  EincS = %.6X\n", nch, nsl, data, SL->EincS);
#endif
      break;

    case 0x80:
      SL->SLL = SL_TAB[data >> 4];

      SL->RR = &YM2612->DR_TAB[((data & 0xF) << 2) + 2];

      SL->EincR = SL->RR[SL->KSR];
      if ((SL->Ecurp == RELEASE) && (SL->Ecnt < ENV_END))
        SL->Einc = SL->EincR;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] SL = %.8X\n", nch, nsl, SL->SLL);
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] RR = %.2X  EincR = %.2X\n", nch, nsl, ((data & 0xF) << 1) | 2, SL->EincR);
#endif
      break;

    case 0x90:
      // SSG-EG envelope shapes :
      /*
         E  At Al H
        
         1  0  0  0  \\\\
        
         1  0  0  1  \___
        
         1  0  1  0  \/\/
                      ___
         1  0  1  1  \
        
         1  1  0  0  ////
                      ___
         1  1  0  1  /
        
         1  1  1  0  /\/\
        
         1  1  1  1  /___
        
         E  = SSG-EG enable
         At = Start negate
         Al = Altern
         H  = Hold */

      if (YM2612->Enable_SSGEG)
        data = 0;
      if (data & 0x08)
        SL->SEG = data & 0x0F;
      else
        SL->SEG = 0;

#if YM_DEBUG_LEVEL > 1
      fprintf(debug_file, "CHANNEL[%d], SLOT[%d] SSG-EG = %.2X\n", nch, nsl, data);
#endif
      break;
  }

  return 0;
}